

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

int Mpm_CutAlloc(Mpm_Man_t *p,int nLeaves,Mpm_Cut_t **ppCut)

{
  Mmr_Step_t *p_00;
  int iVar1;
  Mpm_Cut_t *pMVar2;
  int hHandle;
  Mpm_Cut_t **ppCut_local;
  int nLeaves_local;
  Mpm_Man_t *p_local;
  
  p_00 = p->pManCuts;
  iVar1 = Mpm_CutWordNum(nLeaves);
  iVar1 = Mmr_StepFetch(p_00,iVar1);
  pMVar2 = (Mpm_Cut_t *)Mmr_StepEntry(p->pManCuts,iVar1);
  *ppCut = pMVar2;
  *(uint *)&(*ppCut)->field_0x4 = *(uint *)&(*ppCut)->field_0x4 & 0x7ffffff | nLeaves << 0x1b;
  (*ppCut)->hNext = 0;
  *(uint *)&(*ppCut)->field_0x4 = *(uint *)&(*ppCut)->field_0x4 & 0xfbffffff;
  *(uint *)&(*ppCut)->field_0x4 = *(uint *)&(*ppCut)->field_0x4 & 0xfdffffff;
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

//#define MIG_RUNTIME

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Cut manipulation.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline int Mpm_CutAlloc( Mpm_Man_t * p, int nLeaves, Mpm_Cut_t ** ppCut )  
{ 
    int hHandle = Mmr_StepFetch( p->pManCuts, Mpm_CutWordNum(nLeaves) );
    *ppCut      = (Mpm_Cut_t *)Mmr_StepEntry( p->pManCuts, hHandle );
    (*ppCut)->nLeaves  = nLeaves;
    (*ppCut)->hNext    = 0;
    (*ppCut)->fUseless = 0;
    (*ppCut)->fCompl   = 0;
    return hHandle;
}